

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serializer.cpp
# Opt level: O0

FSerializer * Serialize(FSerializer *arc,char *key,bool *value,bool *defval)

{
  bool bVar1;
  Value *this;
  Value *val;
  bool *defval_local;
  bool *value_local;
  char *key_local;
  FSerializer *arc_local;
  
  bVar1 = FSerializer::isWriting(arc);
  if (bVar1) {
    bVar1 = FWriter::inObject(arc->w);
    if (((!bVar1) || (defval == (bool *)0x0)) || ((*value & 1U) != (*defval & 1U))) {
      FSerializer::WriteKey(arc,key);
      FWriter::Bool(arc->w,(bool)(*value & 1));
    }
  }
  else {
    this = FReader::FindKey(arc->r,key);
    if (this != (Value *)0x0) {
      bVar1 = rapidjson::
              GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              ::IsBool(this);
      if (!bVar1) {
        __assert_fail("val->IsBool()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/serializer.cpp"
                      ,0x499,"FSerializer &Serialize(FSerializer &, const char *, bool &, bool *)");
      }
      bVar1 = rapidjson::
              GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              ::IsBool(this);
      if (bVar1) {
        bVar1 = rapidjson::
                GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                ::GetBool(this);
        *value = bVar1;
      }
      else {
        Printf("\x1cGboolean type expected for \'%s\'",key);
        arc->mErrors = arc->mErrors + 1;
      }
    }
  }
  return arc;
}

Assistant:

FSerializer &Serialize(FSerializer &arc, const char *key, bool &value, bool *defval)
{
	if (arc.isWriting())
	{
		if (!arc.w->inObject() || defval == nullptr || value != *defval)
		{
			arc.WriteKey(key);
			arc.w->Bool(value);
		}
	}
	else
	{
		auto val = arc.r->FindKey(key);
		if (val != nullptr)
		{
			assert(val->IsBool());
			if (val->IsBool())
			{
				value = val->GetBool();
			}
			else
			{
				Printf(TEXTCOLOR_RED "boolean type expected for '%s'", key);
				arc.mErrors++;
			}
		}
	}
	return arc;
}